

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.h
# Opt level: O1

string * __thiscall
cmExportTryCompileFileGenerator::GetCxxModulesDirectory_abi_cxx11_
          (cmExportTryCompileFileGenerator *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

std::string GetCxxModulesDirectory() const override { return {}; }